

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::function_types_comment_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_function *fn)

{
  t_struct *ptVar1;
  ostream *poVar2;
  pointer pptVar3;
  ostringstream out;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  ptVar1 = fn->arglist_;
  std::operator<<(&local_1a8,"\"");
  pptVar3 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (pptVar3 !=
         (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_208,(string *)&(*pptVar3)->name_);
    t_generator::camelcase(&local_1c8,(t_generator *)this,&local_208);
    poVar2 = std::operator<<(&local_1a8,(string *)&local_1c8);
    poVar2 = std::operator<<(poVar2,": ");
    type_name_abi_cxx11_(&local_1e8,this,(*pptVar3)->type_);
    std::operator<<(poVar2,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    pptVar3 = pptVar3 + 1;
    if (pptVar3 !=
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator<<(&local_1a8,", ");
    }
  }
  std::operator<<(&local_1a8,"\"");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::function_types_comment(t_function* fn) {
  std::ostringstream out;
  const vector<t_field*>& fields = fn->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << "\"";

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    out << camelcase((*f_iter)->get_name()) << ": " << type_name((*f_iter)->get_type());
    if ((f_iter + 1) != fields.end()) {
      out << ", ";
    }
  }

  out << "\"";

  return out.str();
}